

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O2

QObject * __thiscall QFactoryLoader::instanceHelper_locked(QFactoryLoader *this,int index)

{
  QList<QObject_*(*)()> *this_00;
  QLibraryPrivate *this_01;
  qsizetype qVar1;
  _func_QObject_ptr *p_Var2;
  bool bVar3;
  Result RVar4;
  QCborError QVar5;
  ulong uVar6;
  const_reference pvVar7;
  pointer pbVar8;
  QObject *pQVar9;
  QStaticPlugin *pQVar10;
  QObject *pQVar11;
  QObject *extraout_RAX;
  pointer pp_Var12;
  QtPluginMetaDataKeys key;
  QStaticPlugin *pQVar13;
  ulong __n;
  QObject *pQVar14;
  long in_FS_OFFSET;
  QObject *local_e8;
  QArrayDataPointer<QStaticPlugin> local_c8;
  QArrayDataPointer<char> local_a8;
  QArrayDataPointer<char> local_88;
  QFactoryLoaderIidSearch local_70;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __n = (ulong)index;
  uVar6 = (long)(this->d).libraries.
                super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->d).libraries.
                super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (__n < uVar6) {
    pvVar7 = std::
             vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
             ::operator[](&(this->d).libraries,__n);
    this_01 = (pvVar7->_M_t).super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>._M_t.
              super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
              super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl;
    pbVar8 = QList<bool>::data(&(this->d).loadedLibraries);
    pbVar8[__n] = true;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      pQVar9 = QLibraryPrivate::pluginInstance(this_01);
      return pQVar9;
    }
  }
  else {
    local_e8 = (QObject *)(this->d).iid.d.ptr;
    if (local_e8 == (QObject *)0x0) {
      local_e8 = (QObject *)&QByteArray::_empty;
    }
    qVar1 = (this->d).iid.d.size;
    local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.ptr = (QStaticPlugin *)&DAT_aaaaaaaaaaaaaaaa;
    QPluginLoader::staticPlugins();
    pQVar10 = local_c8.ptr + local_c8.size;
    pQVar11 = (QObject *)(long)(index - (int)uVar6);
    pQVar14 = (QObject *)0x0;
    pQVar9 = pQVar11;
    for (pQVar13 = local_c8.ptr; pQVar13 != pQVar10; pQVar13 = pQVar13 + 1) {
      p_Var2 = pQVar13->instance;
      local_70._16_8_ = 0xaaaaaaaaaaaaaa00;
      local_70.iid.m_data = (char *)local_e8;
      pQVar9 = local_e8;
      local_70.iid.m_size = qVar1;
      if ((*pQVar13->rawMetaData & 0xfe) == 0) {
        local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_88.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::fromRawData
                  ((QByteArray *)&local_88,(char *)((long)pQVar13->rawMetaData + 4),
                   pQVar13->rawMetaDataSize + -4);
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QCborStreamReader::QCborStreamReader((QCborStreamReader *)local_58,(QByteArray *)&local_88);
        if (local_58[0x10] == 0xa0) {
          bVar3 = QCborStreamReader::_enterContainer_helper((QCborStreamReader *)local_58);
          if (bVar3) {
            do {
              if (local_58[0x10] == 0xff) {
                bVar3 = QCborStreamReader::leaveContainer((QCborStreamReader *)local_58);
                if (!bVar3) break;
                goto LAB_002aae2f;
              }
              if (local_58[0x10] < 0x21) {
                uVar6 = -(ulong)(local_58[0x10] == 0x20) ^ local_58._0_8_;
                key = (QtPluginMetaDataKeys)uVar6;
                if ((long)(int)key != uVar6) goto LAB_002aae2f;
                bVar3 = QCborStreamReader::next((QCborStreamReader *)local_58,10000);
                if (!bVar3) {
                  QCborStreamReader::lastError((QCborStreamReader *)local_58);
                  goto LAB_002aae2f;
                }
                RVar4 = anon_unknown.dwarf_8e8152::QFactoryLoaderIidSearch::operator()
                                  (&local_70,key,(QCborStreamReader *)local_58);
              }
              else {
                if (local_58[0x10] != 0x60) goto LAB_002aae2f;
                local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_a8.ptr = &DAT_aaaaaaaaaaaaaaaa;
                QCborStreamReader::readAllUtf8String
                          ((QByteArray *)&local_a8,(QCborStreamReader *)local_58);
                bVar3 = QByteArray::isNull((QByteArray *)&local_a8);
                if (bVar3) {
                  RVar4 = 0xaaaaaaaa;
                  QCborStreamReader::lastError((QCborStreamReader *)local_58);
                }
                else {
                  anon_unknown.dwarf_8e8152::QFactoryLoaderIidSearch::skip
                            ((QCborStreamReader *)local_58);
                  RVar4 = ContinueSearch;
                }
                QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
                if (bVar3) goto LAB_002aae2f;
              }
              QVar5 = QCborStreamReader::lastError((QCborStreamReader *)local_58);
              if ((RVar4 != ContinueSearch) || (QVar5.c != NoError)) goto LAB_002aae2f;
            } while( true );
          }
LAB_002aae22:
          QCborStreamReader::lastError((QCborStreamReader *)local_58);
        }
        else if (local_58[0x10] == 0xff) goto LAB_002aae22;
LAB_002aae2f:
        QCborStreamReader::~QCborStreamReader((QCborStreamReader *)local_58);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
        pQVar9 = extraout_RAX;
        if ((local_70._16_8_ & 1) != 0) {
          if (pQVar14 == pQVar11) {
            this_00 = &(this->d).usedStaticInstances;
            if ((this->d).usedStaticInstances.d.size <= (long)pQVar11) {
              QList<QObject_*(*)()>::resize(this_00,(qsizetype)((long)&pQVar11->_vptr_QObject + 1));
            }
            pp_Var12 = QList<QObject_*(*)()>::data(this_00);
            pp_Var12[(long)pQVar11] = p_Var2;
            pQVar9 = (*p_Var2)();
            break;
          }
          pQVar14 = (QObject *)((long)&pQVar14->_vptr_QObject + 1);
        }
      }
    }
    pQVar11 = (QObject *)0x0;
    if (pQVar13 != pQVar10) {
      pQVar11 = pQVar9;
    }
    QArrayDataPointer<QStaticPlugin>::~QArrayDataPointer(&local_c8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return pQVar11;
    }
  }
  __stack_chk_fail();
}

Assistant:

inline QObject *QFactoryLoader::instanceHelper_locked(int index) const
{
#if QT_CONFIG(library)
    if (size_t(index) < d->libraries.size()) {
        QLibraryPrivate *library = d->libraries[index].get();
        d->loadedLibraries[index] = true;
        return library->pluginInstance();
    }
    // we know d->libraries.size() <= index <= numeric_limits<decltype(index)>::max() → no overflow
    index -= static_cast<int>(d->libraries.size());
#endif

    QLatin1StringView iid(d->iid.constData(), d->iid.size());
    const QList<QStaticPlugin> staticPlugins = QPluginLoader::staticPlugins();
    qsizetype i = 0;
    for (QStaticPlugin plugin : staticPlugins) {
        QByteArrayView pluginData(static_cast<const char *>(plugin.rawMetaData), plugin.rawMetaDataSize);
        if (!isIidMatch(pluginData, iid))
            continue;

        if (i == index) {
            if (d->usedStaticInstances.size() <= i)
                d->usedStaticInstances.resize(i + 1);
            d->usedStaticInstances[i] = plugin.instance;
            return plugin.instance();
        }
        ++i;
    }

    return nullptr;
}